

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O0

bool __thiscall
kainjow::mustache::
basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
render_variable(basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *this,render_handler *handler,
               basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *var,context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *ctx,bool escaped)

{
  context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pcVar1;
  context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *var_00;
  basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *handler_00;
  bool bVar2;
  byte bVar3;
  string local_228 [32];
  ostringstream local_208 [8];
  streamstring ss;
  string_type local_90;
  render_lambda_escape local_70;
  render_lambda_escape escape_opt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *varstr;
  context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pcStack_30;
  bool escaped_local;
  context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ctx_local;
  basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *var_local;
  render_handler *handler_local;
  basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  varstr._7_1_ = escaped;
  pcStack_30 = ctx;
  ctx_local = (context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)var;
  var_local = (basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)handler;
  handler_local = (render_handler *)this;
  bVar2 = basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::is_string(var);
  if (bVar2) {
    local_40 = basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::string_value((basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)ctx_local);
    pcVar1 = pcStack_30;
    if ((varstr._7_1_ & 1) == 0) {
      std::__cxx11::string::string((string *)&local_60,(string *)local_40);
    }
    else {
      Catch::clara::std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(&local_60,&this->escape_,local_40);
    }
    render_result(this,pcVar1,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    bVar2 = basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::is_lambda((basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)ctx_local);
    handler_00 = var_local;
    var_00 = ctx_local;
    pcVar1 = pcStack_30;
    if (bVar2) {
      bVar3 = ~varstr._7_1_;
      local_70 = bVar3 & unescape;
      std::__cxx11::string::string((string *)&local_90);
      this_local._7_1_ =
           render_lambda(this,(render_handler *)handler_00,
                         (basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)var_00,pcVar1,bVar3 & unescape,&local_90,false);
      std::__cxx11::string::~string((string *)&local_90);
      goto LAB_00361fc1;
    }
    bVar2 = basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::is_lambda2((basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)ctx_local);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_208);
      std::operator<<((ostream *)local_208,
                      "Lambda with render argument is not allowed for regular variables");
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=((string *)this,local_228);
      std::__cxx11::string::~string(local_228);
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_208);
      goto LAB_00361fc1;
    }
  }
  this_local._7_1_ = 1;
LAB_00361fc1:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool render_variable(const render_handler& handler, const basic_data<string_type>* var, context_internal<string_type>& ctx, bool escaped) {
        if (var->is_string()) {
            const auto& varstr = var->string_value();
            render_result(ctx, escaped ? escape_(varstr) : varstr);
        } else if (var->is_lambda()) {
            const render_lambda_escape escape_opt = escaped ? render_lambda_escape::escape : render_lambda_escape::unescape;
            return render_lambda(handler, var, ctx, escape_opt, {}, false);
        } else if (var->is_lambda2()) {
            using streamstring = std::basic_ostringstream<typename string_type::value_type>;
            streamstring ss;
            ss << "Lambda with render argument is not allowed for regular variables";
            error_message_ = ss.str();
            return false;
        }
        return true;
    }